

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O2

void R_DeinitColormaps(void)

{
  FDynamicColormap *pFVar1;
  FDynamicColormap *pFVar2;
  
  TArray<FSpecialColormap,_FSpecialColormap>::Clear(&SpecialColormaps);
  TArray<FakeCmap,_FakeCmap>::Clear(&fakecmaps);
  if (realcolormaps != (BYTE *)0x0) {
    operator_delete__(realcolormaps);
    realcolormaps = (BYTE *)0x0;
  }
  pFVar2 = NormalLight.Next;
  if (realfbcolormaps != (BYTE *)0x0) {
    operator_delete__(realfbcolormaps);
    realfbcolormaps = (BYTE *)0x0;
    pFVar2 = NormalLight.Next;
  }
  while (pFVar2 != (FDynamicColormap *)0x0) {
    pFVar1 = pFVar2->Next;
    if (pFVar2->Maps != (BYTE *)0x0) {
      operator_delete__(pFVar2->Maps);
    }
    operator_delete(pFVar2,0x20);
    pFVar2 = pFVar1;
  }
  NormalLight.Next = (FDynamicColormap *)0x0;
  return;
}

Assistant:

void R_DeinitColormaps ()
{
	SpecialColormaps.Clear();
	fakecmaps.Clear();
	if (realcolormaps != NULL)
	{
		delete[] realcolormaps;
		realcolormaps = NULL;
	}
	if (realfbcolormaps != NULL)
	{
		delete[] realfbcolormaps;
		realfbcolormaps = NULL;
	}
	FreeSpecialLights();
}